

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebuggerObject.cpp
# Opt level: O0

DynamicObject * __thiscall
JsrtDebuggerObjectProperty::GetJSONObject
          (JsrtDebuggerObjectProperty *this,ScriptContext *scriptContext,bool forceSetValueProp)

{
  char16_t *value;
  LPCWSTR pWVar1;
  int iVar2;
  uint value_00;
  JavascriptLibrary *this_00;
  undefined4 extraout_var;
  size_t len;
  JsrtDebugPropertyId local_40;
  JsrtDebugPropertyId local_3c;
  char16_t *local_38;
  LPCWSTR name;
  DynamicObject *propertyObject;
  IDiagObjectModelDisplay *objectDisplayRef;
  ScriptContext *pSStack_18;
  bool forceSetValueProp_local;
  ScriptContext *scriptContext_local;
  JsrtDebuggerObjectProperty *this_local;
  
  objectDisplayRef._7_1_ = forceSetValueProp;
  pSStack_18 = scriptContext;
  scriptContext_local = (ScriptContext *)this;
  propertyObject =
       (DynamicObject *)
       Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>::GetStrongReference
                 (this->objectDisplay);
  name = (LPCWSTR)0x0;
  if (propertyObject != (DynamicObject *)0x0) {
    this_00 = Js::ScriptContext::GetLibrary(pSStack_18);
    name = (LPCWSTR)Js::JavascriptLibrary::CreateObject(this_00,false,0);
    iVar2 = (**(propertyObject->super_RecyclableObject).super_FinalizableObject.
               super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject)();
    pWVar1 = name;
    local_38 = (char16_t *)CONCAT44(extraout_var,iVar2);
    JsrtDebugPropertyId::JsrtDebugPropertyId(&local_3c,name);
    value = local_38;
    len = PAL_wcslen(local_38);
    JsrtDebugUtils::AddPropertyToObject((DynamicObject *)pWVar1,local_3c,value,len,pSStack_18);
    JsrtDebugUtils::AddPropertyType
              ((DynamicObject *)name,(IDiagObjectModelDisplay *)propertyObject,pSStack_18,
               (bool)(objectDisplayRef._7_1_ & 1));
    pWVar1 = name;
    JsrtDebugPropertyId::JsrtDebugPropertyId(&local_40,handle);
    value_00 = JsrtDebuggerObjectBase::GetHandle(&this->super_JsrtDebuggerObjectBase);
    JsrtDebugUtils::AddPropertyToObject((DynamicObject *)pWVar1,local_40,value_00,pSStack_18);
    Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>::ReleaseStrongReference
              (this->objectDisplay);
  }
  return (DynamicObject *)name;
}

Assistant:

Js::DynamicObject * JsrtDebuggerObjectProperty::GetJSONObject(Js::ScriptContext* scriptContext, bool forceSetValueProp)
{
    Js::IDiagObjectModelDisplay* objectDisplayRef = this->objectDisplay->GetStrongReference();

    Js::DynamicObject* propertyObject = nullptr;

    if (objectDisplayRef != nullptr)
    {
        propertyObject = scriptContext->GetLibrary()->CreateObject();

        LPCWSTR name = objectDisplayRef->Name();

        JsrtDebugUtils::AddPropertyToObject(propertyObject, JsrtDebugPropertyId::name, name, wcslen(name), scriptContext);

        JsrtDebugUtils::AddPropertyType(propertyObject, objectDisplayRef, scriptContext, forceSetValueProp); // Will add type, value, display, className, propertyAttributes

        JsrtDebugUtils::AddPropertyToObject(propertyObject, JsrtDebugPropertyId::handle, this->GetHandle(), scriptContext);

        this->objectDisplay->ReleaseStrongReference();
    }

    return propertyObject;
}